

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O2

void Abc_BufCollectTfiCone_rec(Abc_Obj_t *pNode,Vec_Int_t *vNodes)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  
  iVar1 = Abc_NodeIsTravIdCurrent(pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNode);
    uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar2 != 2) && (uVar2 != 5)) {
      if (uVar2 == 7) {
        for (lVar3 = 0; lVar3 < (pNode->vFanins).nSize; lVar3 = lVar3 + 1) {
          Abc_BufCollectTfiCone_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar3]],vNodes)
          ;
        }
        Vec_IntPush(vNodes,pNode->Id);
        return;
      }
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclBuffer.c"
                    ,0x27b,"void Abc_BufCollectTfiCone_rec(Abc_Obj_t *, Vec_Int_t *)");
    }
  }
  return;
}

Assistant:

void Abc_BufCollectTfiCone_rec( Abc_Obj_t * pNode, Vec_Int_t * vNodes )
{
    Abc_Obj_t * pNext;
    int i;
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    Abc_NodeSetTravIdCurrent( pNode );
    if ( Abc_ObjIsCi(pNode) )
        return;
    assert( Abc_ObjIsNode(pNode) );
    Abc_ObjForEachFanin( pNode, pNext, i )
        Abc_BufCollectTfiCone_rec( pNext, vNodes );
    Vec_IntPush( vNodes, Abc_ObjId(pNode) );
}